

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

int sat_solver3_addclause(sat_solver3 *s,lit *begin,lit *end)

{
  uint uVar1;
  uint *begin_00;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x6a8,"int sat_solver3_addclause(sat_solver3 *, lit *, lit *)");
  }
  veci_resize(&s->temp_clause,0);
  for (; begin < end; begin = begin + 1) {
    veci_push(&s->temp_clause,*begin);
  }
  begin_00 = (uint *)(s->temp_clause).ptr;
  iVar2 = (s->temp_clause).size;
  iVar6 = (int)*begin_00 >> 1;
  puVar3 = begin_00;
  while (puVar3 = puVar3 + 1, puVar3 < begin_00 + iVar2) {
    uVar4 = *puVar3;
    puVar5 = puVar3;
    if (iVar6 < (int)uVar4 >> 1) {
      iVar6 = (int)uVar4 >> 1;
    }
    for (; (begin_00 < puVar5 && ((int)uVar4 < (int)puVar5[-1])); puVar5 = puVar5 + -1) {
      *puVar5 = puVar5[-1];
    }
    *puVar5 = uVar4;
  }
  sat_solver3_setnvars(s,iVar6 + 1);
  uVar4 = 0xfffffffe;
  iVar6 = 1;
  puVar3 = begin_00;
  puVar5 = begin_00;
  while( true ) {
    if (begin_00 + iVar2 <= puVar3) {
      if (puVar5 == begin_00) {
        iVar6 = 0;
      }
      else {
        if ((long)puVar5 - (long)begin_00 == 4) {
          iVar2 = sat_solver3_enqueue(s,*begin_00,0);
          return iVar2;
        }
        sat_solver3_clause_new(s,(lit *)begin_00,(lit *)puVar5,0);
      }
      return iVar6;
    }
    uVar1 = *puVar3;
    if ((uVar1 ^ uVar4) == 1) {
      return 1;
    }
    if ((uVar1 & 1) == (int)s->assigns[(int)uVar1 >> 1]) break;
    if (s->assigns[(int)uVar1 >> 1] == '\x03' && uVar1 != uVar4) {
      *puVar5 = uVar1;
      puVar5 = puVar5 + 1;
      uVar4 = uVar1;
    }
    puVar3 = puVar3 + 1;
  }
  return 1;
}

Assistant:

int sat_solver3_addclause(sat_solver3* s, lit* begin, lit* end)
{
    int fVerbose = 0;
    lit *i,*j;
    int maxvar;
    lit last;
    assert( begin < end );
    if ( fVerbose )
    {
        for ( i = begin; i < end; i++ )
            printf( "%s%d ", (*i)&1 ? "!":"", (*i)>>1 );
        printf( "\n" );
    }

    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver3_setnvars(s,maxvar+1);

    // delete duplicates
    last = lit_Undef;
    for (i = j = begin; i < end; i++){
        //printf("lit: "L_LIT", value = %d\n", L_lit(*i), (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]));
        if (*i == lit_neg(last) || var_value(s, lit_var(*i)) == lit_sign(*i))
            return true;   // tautology
        else if (*i != last && var_value(s, lit_var(*i)) == varX)
            last = *j++ = *i;
    }
//    j = i;

    if (j == begin)          // empty clause
        return false;

    if (j - begin == 1) // unit clause
        return sat_solver3_enqueue(s,*begin,0);

    // create new clause
    sat_solver3_clause_new(s,begin,j,0);
    return true;
}